

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int ARKStepGetNonlinearSystemData
              (void *arkode_mem,realtype *tcur,N_Vector *zpred,N_Vector *z,N_Vector *Fi,
              realtype *gamma,N_Vector *sdata,void **user_data)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_38;
  ARKodeMem local_30;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepGetNonlinearSystemData",&local_30,&local_38);
  if (iVar1 == 0) {
    *tcur = local_30->tcur;
    *zpred = local_38->zpred;
    *z = local_30->ycur;
    *Fi = local_38->Fi[local_38->istage];
    *gamma = local_38->gamma;
    *sdata = local_38->sdata;
    *user_data = local_30->user_data;
  }
  return iVar1;
}

Assistant:

int ARKStepGetNonlinearSystemData(void *arkode_mem, realtype *tcur,
                                  N_Vector *zpred, N_Vector *z,
                                  N_Vector *Fi, realtype *gamma,
                                  N_Vector *sdata, void **user_data)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepGetNonlinearSystemData",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *tcur      = ark_mem->tcur;
  *zpred     = step_mem->zpred;
  *z         = ark_mem->ycur;
  *Fi        = step_mem->Fi[step_mem->istage];
  *gamma     = step_mem->gamma;
  *sdata     = step_mem->sdata;
  *user_data = ark_mem->user_data;

  return(ARK_SUCCESS);
}